

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_container_grow(array_container_t *container,int32_t min,_Bool preserve)

{
  int32_t val;
  int32_t iVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  uint16_t *array;
  int32_t new_capacity;
  int32_t max;
  _Bool preserve_local;
  int32_t min_local;
  array_container_t *container_local;
  
  iVar1 = 0x10000;
  if (min < 0x1001) {
    iVar1 = 0x1000;
  }
  val = grow_capacity(container->capacity);
  iVar1 = clamp(val,min,iVar1);
  container->capacity = iVar1;
  puVar3 = container->array;
  if (preserve) {
    puVar2 = (uint16_t *)realloc(puVar3,(long)iVar1 << 1);
    container->array = puVar2;
    if (container->array == (uint16_t *)0x0) {
      free(puVar3);
    }
  }
  else {
    if (puVar3 != (uint16_t *)0x0) {
      free(puVar3);
    }
    puVar3 = (uint16_t *)malloc((long)iVar1 << 1);
    container->array = puVar3;
  }
  if (container->array == (uint16_t *)0x0) {
    fprintf(_stderr,"could not allocate memory\n");
  }
  if (container->array == (uint16_t *)0x0) {
    __assert_fail("container->array != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x27bd,"void array_container_grow(array_container_t *, int32_t, _Bool)");
  }
  return;
}

Assistant:

void array_container_grow(array_container_t *container, int32_t min,
                          bool preserve) {

    int32_t max = (min <= DEFAULT_MAX_SIZE ? DEFAULT_MAX_SIZE : 65536);
    int32_t new_capacity = clamp(grow_capacity(container->capacity), min, max);

    container->capacity = new_capacity;
    uint16_t *array = container->array;

    if (preserve) {
        container->array =
            (uint16_t *)realloc(array, new_capacity * sizeof(uint16_t));
        if (container->array == NULL) free(array);
    } else {
        // Jon Strabala reports that some tools complain otherwise
        if (array != NULL) {
          free(array);
        }
        container->array = (uint16_t *)malloc(new_capacity * sizeof(uint16_t));
    }

    //  handle the case where realloc fails
    if (container->array == NULL) {
      fprintf(stderr, "could not allocate memory\n");
    }
    assert(container->array != NULL);
}